

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O2

void __thiscall kmp_taskloop_bounds_t::set_ub(kmp_taskloop_bounds_t *this,kmp_uint64 ub)

{
  void *pvVar1;
  
  if (((this->taskdata->td_flags).field_0x3 & 1) == 0) {
    *(kmp_uint64 *)((long)&this->task->shareds + this->upper_offset) = ub;
    return;
  }
  pvVar1 = this->task->shareds;
  if (this->taskdata->td_size_loop_bounds == 4) {
    *(int *)((long)pvVar1 + 4) = (int)ub;
    return;
  }
  *(kmp_uint64 *)((long)pvVar1 + 8) = ub;
  return;
}

Assistant:

void set_ub(kmp_uint64 ub) {
#if defined(KMP_GOMP_COMPAT)
    // Intel task just sets the upper bound normally
    if (!taskdata->td_flags.native) {
      *(kmp_uint64 *)((char *)task + upper_offset) = ub;
    } else {
      // GOMP task has to take into account the sizeof(long)
      if (taskdata->td_size_loop_bounds == 4) {
        kmp_uint32 *upper = RCAST(kmp_uint32 *, task->shareds) + 1;
        *upper = (kmp_uint32)ub;
      } else {
        kmp_uint64 *upper = RCAST(kmp_uint64 *, task->shareds) + 1;
        *upper = (kmp_uint64)ub;
      }
    }
#else
    *(kmp_uint64 *)((char *)task + upper_offset) = ub;
#endif // defined(KMP_GOMP_COMPAT)
  }